

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConditionalConstraint * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConditionalConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&,slang::ast::Constraint_const*&>
          (BumpAllocator *this,Expression *args,Constraint *args_1,Constraint **args_2)

{
  Constraint *pCVar1;
  ConditionalConstraint *pCVar2;
  
  pCVar2 = (ConditionalConstraint *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalConstraint *)this->endPtr < pCVar2 + 1) {
    pCVar2 = (ConditionalConstraint *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pCVar2 + 1);
  }
  pCVar1 = *args_2;
  (pCVar2->super_Constraint).kind = Conditional;
  (pCVar2->super_Constraint).syntax = (ConstraintItemSyntax *)0x0;
  pCVar2->predicate = args;
  pCVar2->ifBody = args_1;
  pCVar2->elseBody = pCVar1;
  return pCVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }